

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::~IfcOrientedEdge(IfcOrientedEdge *this)

{
  ~IfcOrientedEdge((IfcOrientedEdge *)&this[-1].super_IfcEdge.field_0x50);
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}